

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

void render_element(element_t *element,render_context_t *context,render_state_t *state)

{
  char *pcVar1;
  size_t sVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  render_state **pprVar5;
  long lVar6;
  _Bool _Var7;
  int iVar8;
  char *it_1;
  render_state *prVar9;
  element_t *element_00;
  attribute *paVar10;
  byte *pbVar11;
  byte *pbVar12;
  char *pcVar13;
  char *pcVar14;
  plutovg_surface_t *surface;
  view_position_t *position;
  plutovg_path_t *path;
  char *pcVar15;
  long lVar16;
  size_t sVar17;
  char *it_3;
  bool bVar18;
  element *peVar19;
  byte *end;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float x;
  length_t x_1;
  length_t y;
  length_t ry;
  char *it;
  length_t rx;
  render_state_t new_state;
  float local_110;
  float local_10c;
  length_t local_f0;
  undefined1 local_e8 [16];
  length_t local_d8;
  length_t local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  length_t local_a0;
  plutovg_matrix_t local_98;
  length_t local_80;
  render_state_t local_78;
  
  switch(element->id) {
  case 1:
    _Var7 = is_display_none((element_t *)element->attributes);
    if (_Var7) {
      return;
    }
    _Var7 = is_visibility_hidden(element);
    if (_Var7) {
      return;
    }
    local_98.a = 0.0;
    local_98.b = 1.4013e-45;
    parse_length(element,0x17,(length_t *)&local_98,false,false);
    fVar21 = local_98.a;
    if ((local_98.a == 0.0) && (!NAN(local_98.a))) {
      return;
    }
    local_f0.value = 0.0;
    local_f0.type = length_type_fixed;
    local_d8.value = 0.0;
    local_d8.type = length_type_fixed;
    parse_length(element,5,&local_f0,true,false);
    parse_length(element,6,&local_d8,true,false);
    fVar26 = local_f0.value;
    if (local_f0.type == length_type_percent) {
      fVar26 = (state->view_width * local_f0.value) / 100.0;
    }
    local_e8 = ZEXT416((uint)fVar26);
    fVar26 = local_d8.value;
    if (local_d8.type == length_type_percent) {
      fVar26 = (state->view_height * local_d8.value) / 100.0;
    }
    local_c8 = ZEXT416((uint)fVar26);
    if (local_98.b == 2.8026e-45) {
      fVar26 = hypotf(state->view_width,state->view_height);
      fVar21 = (fVar21 * (fVar26 / 1.4142135)) / 100.0;
    }
    render_state_begin(element,&local_78,state);
    local_78.extents.y = (float)local_c8._0_4_ - fVar21;
    local_78.extents.x = (float)local_e8._0_4_ - fVar21;
    local_78.extents.h = fVar21 + fVar21;
    local_78.extents.w = fVar21 + fVar21;
    plutovg_path_reset(context->document->path);
    plutovg_path_add_circle
              (context->document->path,(float)local_e8._0_4_,(float)local_c8._0_4_,fVar21);
    goto LAB_00105bcf;
  default:
    goto switchD_00104d0d_caseD_2;
  case 4:
    _Var7 = is_display_none((element_t *)element->attributes);
    if (_Var7) {
      return;
    }
    _Var7 = is_visibility_hidden(element);
    if (_Var7) {
      return;
    }
    local_98.a = 0.0;
    local_98.b = 1.4013e-45;
    local_f0.value = 0.0;
    local_f0.type = length_type_fixed;
    parse_length(element,0x18,(length_t *)&local_98,false,false);
    parse_length(element,0x19,&local_f0,false,false);
    fVar21 = local_98.a;
    if ((local_98.a == 0.0) && (!NAN(local_98.a))) {
      return;
    }
    local_e8 = ZEXT416((uint)local_f0.value);
    if ((local_f0.value == 0.0) && (!NAN(local_f0.value))) {
      return;
    }
    local_d8.value = 0.0;
    local_d8.type = length_type_fixed;
    local_d0.value = 0.0;
    local_d0.type = length_type_fixed;
    parse_length(element,5,&local_d8,true,false);
    parse_length(element,6,&local_d0,true,false);
    fVar26 = local_d8.value;
    if (local_d8.type == length_type_percent) {
      fVar26 = (state->view_width * local_d8.value) / 100.0;
    }
    local_c8 = ZEXT416((uint)fVar26);
    fVar26 = local_d0.value;
    if (local_d0.type == length_type_percent) {
      fVar26 = (state->view_height * local_d0.value) / 100.0;
    }
    local_b8 = ZEXT416((uint)fVar26);
    if (local_98.b == 2.8026e-45) {
      fVar21 = (fVar21 * state->view_width) / 100.0;
    }
    if (local_f0.type == length_type_percent) {
      local_e8._0_4_ = ((float)local_e8._0_4_ * state->view_height) / 100.0;
    }
    render_state_begin(element,&local_78,state);
    auVar29._4_4_ = local_b8._0_4_;
    auVar29._0_4_ = local_c8._0_4_;
    auVar29._8_4_ = local_c8._4_4_;
    auVar29._12_4_ = local_b8._4_4_;
    auVar3._4_8_ = auVar29._8_8_;
    auVar3._0_4_ = local_b8._0_4_;
    auVar30._0_8_ = auVar3._0_8_ << 0x20;
    auVar30._8_4_ = fVar21;
    auVar30._12_4_ = local_e8._0_4_;
    auVar4._4_8_ = auVar30._8_8_;
    auVar4._0_4_ = (float)local_b8._0_4_ + (float)local_b8._0_4_;
    auVar31._0_8_ = auVar4._0_8_ << 0x20;
    auVar31._8_4_ = fVar21 + fVar21;
    auVar31._12_4_ = (float)local_e8._0_4_ + (float)local_e8._0_4_;
    local_78.extents.y = (float)local_b8._0_4_ - (float)local_e8._0_4_;
    local_78.extents.x = (float)local_c8._0_4_ - fVar21;
    local_78.extents._8_8_ = auVar31._8_8_;
    plutovg_path_reset(context->document->path);
    plutovg_path_add_ellipse
              (context->document->path,(float)local_c8._0_4_,(float)local_b8._0_4_,fVar21,
               (float)local_e8._0_4_);
    goto LAB_00105bcf;
  case 5:
    _Var7 = is_display_none((element_t *)element->attributes);
    if (_Var7) {
      return;
    }
    render_state_begin(element,&local_78,state);
    peVar19 = element->first_child;
    if (peVar19 != (element *)0x0) {
      do {
        render_element(peVar19,context,&local_78);
        peVar19 = peVar19->next_sibling;
      } while (peVar19 != (element *)0x0);
    }
    break;
  case 6:
    _Var7 = is_display_none((element_t *)element->attributes);
    if (_Var7) {
      return;
    }
    _Var7 = is_visibility_hidden(element);
    if (_Var7) {
      return;
    }
    local_d8.value = 0.0;
    local_d8.type = length_type_fixed;
    local_d0.value = 0.0;
    local_d0.type = length_type_fixed;
    parse_length(element,0x29,&local_d8,false,false);
    parse_length(element,0x10,&local_d0,false,false);
    fVar21 = local_d8.value;
    if ((local_d8.value == 0.0) && (!NAN(local_d8.value))) {
      return;
    }
    if ((local_d0.value == 0.0) && (!NAN(local_d0.value))) {
      return;
    }
    local_e8._0_4_ = local_d0.value;
    local_80.value = 0.0;
    local_80.type = length_type_fixed;
    local_a0.value = 0.0;
    local_a0.type = length_type_fixed;
    parse_length(element,0x2a,&local_80,true,false);
    parse_length(element,0x2d,&local_a0,true,false);
    local_c8._0_4_ = local_80.value;
    if (local_80.type == length_type_percent) {
      local_c8._0_4_ = (state->view_width * local_80.value) / 100.0;
    }
    local_b8._0_4_ = local_a0.value;
    if (local_a0.type == length_type_percent) {
      local_b8._0_4_ = (state->view_height * local_a0.value) / 100.0;
    }
    if (local_d8.type == length_type_percent) {
      fVar21 = (fVar21 * state->view_width) / 100.0;
    }
    if (local_d0.type == length_type_percent) {
      local_e8._0_4_ = ((float)local_e8._0_4_ * state->view_height) / 100.0;
    }
    render_state_begin(element,&local_78,state);
    local_78.extents.y = (float)local_b8._0_4_;
    local_78.extents.x = (float)local_c8._0_4_;
    local_78.extents.h = (float)local_e8._0_4_;
    local_78.extents.w = fVar21;
    if (local_78.mode != render_mode_bounding) {
      for (paVar10 = element->attributes; paVar10 != (attribute *)0x0; paVar10 = paVar10->next) {
        if (paVar10->id == 0x11) {
          pcVar15 = (paVar10->value).data;
          sVar2 = (paVar10->value).length;
          pcVar1 = pcVar15 + sVar2;
          if ((long)sVar2 < 1) {
            pcVar14 = "data:image/png";
            pcVar13 = pcVar15;
            goto LAB_00105c45;
          }
          pcVar14 = "data:image/png" + sVar2;
          sVar17 = 0;
          goto LAB_00105c1a;
        }
      }
    }
    break;
  case 7:
    _Var7 = is_display_none((element_t *)element->attributes);
    if (_Var7) {
      return;
    }
    _Var7 = is_visibility_hidden(element);
    if (_Var7) {
      return;
    }
    local_98.a = 0.0;
    local_98.b = 1.4013e-45;
    local_f0.value = 0.0;
    local_f0.type = length_type_fixed;
    local_d8.value = 0.0;
    local_d8.type = length_type_fixed;
    local_d0.value = 0.0;
    local_d0.type = length_type_fixed;
    parse_length(element,0x2b,(length_t *)&local_98,true,false);
    parse_length(element,0x2e,&local_f0,true,false);
    parse_length(element,0x2c,&local_d8,true,false);
    parse_length(element,0x2f,&local_d0,true,false);
    fVar21 = local_98.a;
    if (local_98.b == 2.8026e-45) {
      fVar21 = (state->view_width * local_98.a) / 100.0;
    }
    fVar26 = local_f0.value;
    if (local_f0.type == length_type_percent) {
      fVar26 = (state->view_height * local_f0.value) / 100.0;
    }
    local_e8 = ZEXT416((uint)fVar26);
    fVar26 = local_d8.value;
    if (local_d8.type == length_type_percent) {
      fVar26 = (state->view_width * local_d8.value) / 100.0;
    }
    local_c8 = ZEXT416((uint)fVar26);
    fVar26 = local_d0.value;
    if (local_d0.type == length_type_percent) {
      fVar26 = (state->view_height * local_d0.value) / 100.0;
    }
    local_b8 = ZEXT416((uint)fVar26);
    render_state_begin(element,&local_78,state);
    auVar27._4_4_ = local_e8._0_4_;
    auVar27._0_4_ = fVar21;
    auVar27._8_4_ = 0;
    auVar27._12_4_ = local_e8._4_4_;
    auVar28._4_4_ = local_b8._0_4_;
    auVar28._0_4_ = local_c8._0_4_;
    auVar28._8_4_ = local_c8._4_4_;
    auVar28._12_4_ = local_b8._4_4_;
    auVar28 = minps(auVar27,auVar28);
    local_78.extents._8_8_ =
         CONCAT44((float)local_b8._0_4_ - (float)local_e8._0_4_,(float)local_c8._0_4_ - fVar21) &
         0x7fffffff7fffffff;
    local_78.extents._0_8_ = auVar28._0_8_;
    plutovg_path_reset(context->document->path);
    plutovg_path_move_to(context->document->path,fVar21,(float)local_e8._0_4_);
    plutovg_path_line_to(context->document->path,(float)local_c8._0_4_,(float)local_b8._0_4_);
    goto LAB_00105bcf;
  case 9:
    _Var7 = is_display_none((element_t *)element->attributes);
    if (_Var7) {
      return;
    }
    _Var7 = is_visibility_hidden(element);
    if (_Var7) {
      return;
    }
    render_state_begin(element,&local_78,state);
    plutovg_path_reset(context->document->path);
    path = context->document->path;
    for (paVar10 = element->attributes; paVar10 != (attribute *)0x0; paVar10 = paVar10->next) {
      if (paVar10->id == 7) {
        plutovg_path_parse(path,(paVar10->value).data,(int)(paVar10->value).length);
        goto LAB_0010568d;
      }
    }
    goto LAB_00105694;
  case 10:
  case 0xb:
    _Var7 = is_display_none((element_t *)element->attributes);
    if (_Var7) {
      return;
    }
    _Var7 = is_visibility_hidden(element);
    if (_Var7) {
      return;
    }
    render_state_begin(element,&local_78,state);
    plutovg_path_reset(context->document->path);
    path = context->document->path;
    for (paVar10 = element->attributes; paVar10 != (attribute *)0x0; paVar10 = paVar10->next) {
      if (paVar10->id == 0x15) {
        pcVar1 = (paVar10->value).data;
        local_98.a = SUB84(pcVar1,0);
        local_98.b = (float)((ulong)pcVar1 >> 0x20);
        sVar2 = (paVar10->value).length;
        if ((long)sVar2 < 1) goto LAB_00105562;
        end = (byte *)(pcVar1 + sVar2);
        bVar18 = true;
        goto LAB_001053e0;
      }
    }
LAB_00105694:
    plutovg_path_extents(path,&local_78.extents,false);
    draw_shape(element,context,&local_78);
    break;
  case 0xd:
    _Var7 = is_display_none((element_t *)element->attributes);
    if (_Var7) {
      return;
    }
    _Var7 = is_visibility_hidden(element);
    if (_Var7) {
      return;
    }
    local_98.a = 0.0;
    local_98.b = 1.4013e-45;
    local_f0.value = 0.0;
    local_f0.type = length_type_fixed;
    parse_length(element,0x29,(length_t *)&local_98,false,false);
    parse_length(element,0x10,&local_f0,false,false);
    fVar21 = local_98.a;
    if ((local_98.a == 0.0) && (!NAN(local_98.a))) {
      return;
    }
    local_e8._0_4_ = local_f0.value;
    if ((local_f0.value == 0.0) && (!NAN(local_f0.value))) {
      return;
    }
    local_d8.value = 0.0;
    local_d8.type = length_type_fixed;
    local_d0.value = 0.0;
    local_d0.type = length_type_fixed;
    parse_length(element,0x2a,&local_d8,true,false);
    parse_length(element,0x2d,&local_d0,true,false);
    local_c8._0_4_ = local_d8.value;
    if (local_d8.type == length_type_percent) {
      local_c8._0_4_ = (state->view_width * local_d8.value) / 100.0;
    }
    local_b8._0_4_ = local_d0.value;
    if (local_d0.type == length_type_percent) {
      local_b8._0_4_ = (state->view_height * local_d0.value) / 100.0;
    }
    if (local_98.b == 2.8026e-45) {
      fVar21 = (fVar21 * state->view_width) / 100.0;
    }
    if (local_f0.type == length_type_percent) {
      local_e8._0_4_ = ((float)local_e8._0_4_ * state->view_height) / 100.0;
    }
    local_80.value = 0.0;
    local_80.type = length_type_unknown;
    local_a0.value = 0.0;
    local_a0.type = length_type_unknown;
    parse_length(element,0x18,&local_80,false,false);
    parse_length(element,0x19,&local_a0,false,false);
    fVar26 = local_80.value;
    if (local_80.type == length_type_percent) {
      fVar26 = (state->view_width * local_80.value) / 100.0;
    }
    fVar25 = local_a0.value;
    if (local_a0.type == length_type_percent) {
      fVar25 = (state->view_height * local_a0.value) / 100.0;
    }
    fVar22 = fVar25;
    if (local_80.type != length_type_unknown) {
      fVar22 = fVar26;
    }
    fVar26 = fVar22;
    if (local_a0.type != length_type_unknown) {
      fVar26 = fVar25;
    }
    render_state_begin(element,&local_78,state);
    local_78.extents.y = (float)local_b8._0_4_;
    local_78.extents.x = (float)local_c8._0_4_;
    local_78.extents.h = (float)local_e8._0_4_;
    local_78.extents.w = fVar21;
    plutovg_path_reset(context->document->path);
    plutovg_path_add_round_rect
              (context->document->path,(float)local_c8._0_4_,(float)local_b8._0_4_,fVar21,
               (float)local_e8._0_4_,fVar22,fVar26);
LAB_00105bcf:
    draw_shape(element,context,&local_78);
    break;
  case 0xf:
    render_svg(element,context,state);
    return;
  case 0x11:
    _Var7 = is_display_none((element_t *)element->attributes);
    prVar9 = state;
    if (_Var7) {
      return;
    }
    do {
      if (prVar9->element == element) {
        return;
      }
      pprVar5 = &prVar9->parent;
      prVar9 = *pprVar5;
    } while (*pprVar5 != (render_state *)0x0);
    element_00 = resolve_href(context->document,element);
    if (element_00 == (element_t *)0x0) {
      return;
    }
    local_98.a = 0.0;
    local_98.b = 1.4013e-45;
    local_f0.value = 0.0;
    local_f0.type = length_type_fixed;
    parse_length(element,0x2a,(length_t *)&local_98,true,false);
    parse_length(element,0x2d,&local_f0,true,false);
    fVar21 = local_98.a;
    if (local_98.b == 2.8026e-45) {
      fVar21 = (state->view_width * local_98.a) / 100.0;
    }
    local_e8._0_4_ = local_f0.value;
    if (local_f0.type == length_type_percent) {
      local_e8._0_4_ = (state->view_height * local_f0.value) / 100.0;
    }
    render_state_begin(element,&local_78,state);
    plutovg_matrix_translate(&local_78.matrix,fVar21,(float)local_e8._0_4_);
    peVar19 = element_00->parent;
    element_00->parent = element;
    if (element_00->id - 0xfU < 2) {
      render_svg(element_00,context,&local_78);
    }
    else {
      render_element(element_00,context,&local_78);
    }
    element_00->parent = peVar19;
  }
LAB_00105be0:
  render_state_end(&local_78);
switchD_00104d0d_caseD_2:
  return;
LAB_001053e0:
  do {
    _Var7 = parse_float((char **)&local_98,(char *)end,&local_f0.value);
    if (!_Var7) goto LAB_0010568d;
    pbVar11 = (byte *)CONCAT44(local_98.b,local_98.a);
    if (pbVar11 < end) {
      if ((0x2c < (ulong)*pbVar11) || ((0x100100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))
      goto LAB_0010568d;
      bVar20 = true;
      do {
        pbVar12 = pbVar11;
        if ((0x20 < (ulong)*pbVar11) || ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))
        break;
        pbVar11 = pbVar11 + 1;
        bVar20 = pbVar11 < end;
        pbVar12 = end;
      } while (pbVar11 != end);
      pbVar11 = pbVar12;
      if ((((bVar20) && (pbVar12 < end)) && (*pbVar12 == 0x2c)) &&
         (pbVar12 = pbVar12 + 1, pbVar11 = pbVar12, pbVar12 < end)) {
        do {
          pbVar11 = pbVar12;
          if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
          break;
          pbVar12 = pbVar12 + 1;
          pbVar11 = end;
        } while (pbVar12 != end);
      }
    }
    local_98.a = SUB84(pbVar11,0);
    local_98.b = (float)((ulong)pbVar11 >> 0x20);
    if ((end <= pbVar11) ||
       (_Var7 = parse_float((char **)&local_98,(char *)end,&local_d8.value), !_Var7))
    goto LAB_0010568d;
    pbVar11 = (byte *)CONCAT44(local_98.b,local_98.a);
    if (pbVar11 < end) {
      if (((ulong)*pbVar11 < 0x2d) && ((0x100100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0)) {
        bVar20 = true;
        do {
          pbVar12 = pbVar11;
          if ((0x20 < (ulong)*pbVar11) || ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))
          break;
          pbVar11 = pbVar11 + 1;
          bVar20 = pbVar11 < end;
          pbVar12 = end;
        } while (pbVar11 != end);
        pbVar11 = pbVar12;
        if ((((bVar20) && (pbVar12 < end)) && (*pbVar12 == 0x2c)) &&
           (pbVar12 = pbVar12 + 1, pbVar11 = pbVar12, pbVar12 < end)) {
          do {
            pbVar11 = pbVar12;
            if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
            break;
            pbVar12 = pbVar12 + 1;
            pbVar11 = end;
          } while (pbVar12 != end);
        }
        goto LAB_00105528;
      }
    }
    else {
LAB_00105528:
      local_98.a = SUB84(pbVar11,0);
      local_98.b = (float)((ulong)pbVar11 >> 0x20);
    }
    if (bVar18) {
      plutovg_path_move_to(path,local_f0.value,local_d8.value);
    }
    else {
      plutovg_path_line_to(path,local_f0.value,local_d8.value);
    }
    bVar18 = false;
  } while (pbVar11 < end);
LAB_00105562:
  if (element->id == 10) {
    plutovg_path_close(path);
  }
LAB_0010568d:
  path = context->document->path;
  goto LAB_00105694;
  while( true ) {
    if (pcVar15[sVar17] != "data:image/png"[sVar17]) goto LAB_00105c4e;
    sVar17 = sVar17 + 1;
    pcVar13 = pcVar1;
    if (sVar2 == sVar17) break;
LAB_00105c1a:
    pcVar13 = pcVar15 + 0xe;
    if (sVar17 == 0xe) goto LAB_00105cdc;
  }
LAB_00105c45:
  if (*pcVar14 != '\0') {
LAB_00105c4e:
    if ((long)sVar2 < 1) {
      pcVar14 = "data:image/jpg";
      pcVar13 = pcVar15;
    }
    else {
      pcVar14 = "data:image/jpg" + sVar2;
      sVar17 = 0;
      do {
        pcVar13 = pcVar15 + 0xe;
        if (sVar17 == 0xe) goto LAB_00105cdc;
        if (pcVar15[sVar17] != "data:image/jpg"[sVar17]) goto LAB_00105c91;
        sVar17 = sVar17 + 1;
        pcVar13 = pcVar1;
      } while (sVar2 != sVar17);
    }
    if (*pcVar14 != '\0') {
LAB_00105c91:
      if ((long)sVar2 < 1) {
        pcVar14 = "data:image/jpeg";
        pcVar13 = pcVar15;
      }
      else {
        pcVar14 = "data:image/jpeg" + sVar2;
        sVar17 = 0;
        do {
          pcVar13 = pcVar15 + 0xf;
          if (sVar17 == 0xf) goto LAB_00105cdc;
          if (pcVar15[sVar17] != "data:image/jpeg"[sVar17]) goto LAB_00105be0;
          sVar17 = sVar17 + 1;
          pcVar13 = pcVar1;
        } while (sVar2 != sVar17);
      }
      if (*pcVar14 != '\0') goto LAB_00105be0;
    }
  }
LAB_00105cdc:
  if (pcVar13 < pcVar1) {
    pcVar14 = ";base64," + ((long)pcVar1 - (long)pcVar13);
    lVar16 = 0;
    do {
      pcVar15 = pcVar13 + 8;
      if (lVar16 == 8) goto LAB_00105d35;
      if (pcVar13[lVar16] != ";base64,"[lVar16]) goto LAB_00105be0;
      lVar6 = lVar16 + 1;
      lVar16 = lVar16 + 1;
      pcVar15 = pcVar1;
    } while (pcVar13 + lVar6 != pcVar1);
  }
  else {
    pcVar14 = ";base64,";
    pcVar15 = pcVar13;
  }
  if (*pcVar14 == '\0') {
LAB_00105d35:
    surface = plutovg_surface_load_from_image_base64(pcVar15,(int)pcVar1 - (int)pcVar15);
    if (surface != (plutovg_surface_t *)0x0) {
      iVar8 = plutovg_surface_get_width(surface);
      fVar22 = (float)iVar8;
      iVar8 = plutovg_surface_get_height(surface);
      fVar23 = (float)iVar8;
      local_f0.value = 7.00649e-45;
      local_f0.type = length_type_unknown;
      parse_view_position(element,(int)&local_f0,position);
      fVar24 = 0.0;
      fVar26 = fVar21;
      fVar25 = (float)local_e8._0_4_;
      local_110 = fVar23;
      local_10c = fVar22;
      if (local_f0.value == 0.0) {
LAB_00105ee5:
        fVar21 = fVar26;
        fVar26 = 0.0;
      }
      else {
        if (local_f0.type != length_type_fixed) {
          if (local_f0.type == length_type_unknown) {
            fVar32 = fVar21 * (fVar23 / fVar22);
            if (fVar32 < (float)local_e8._0_4_) {
              fVar25 = fVar32;
              if ((int)local_f0.value - 7U < 3) {
                fVar32 = (float)local_e8._0_4_ - fVar32;
              }
              else {
                if (2 < (int)local_f0.value - 4U) goto LAB_00105ea1;
                fVar32 = ((float)local_e8._0_4_ - fVar32) * 0.5;
              }
              local_b8._0_4_ = (float)local_b8._0_4_ + fVar32;
            }
LAB_00105ea1:
            fVar22 = (float)local_e8._0_4_ / (fVar23 / fVar22);
            if ((fVar22 < fVar21) && (fVar26 = fVar22, (uint)local_f0.value < 10)) {
              if ((0x124U >> ((uint)local_f0.value & 0x1f) & 1) == 0) {
                if ((0x248U >> ((uint)local_f0.value & 0x1f) & 1) == 0) goto LAB_00105ee5;
                fVar21 = fVar21 - fVar22;
              }
              else {
                fVar21 = (fVar21 - fVar22) * 0.5;
              }
              local_c8._0_4_ = (float)local_c8._0_4_ + fVar21;
            }
          }
          goto LAB_00105ee5;
        }
        fVar26 = 0.0;
        fVar24 = 0.0;
        if ((float)local_e8._0_4_ < fVar21 * (fVar23 / fVar22)) {
          local_110 = (fVar22 / fVar21) * (float)local_e8._0_4_;
          if ((int)local_f0.value - 7U < 3) {
            fVar24 = fVar23 - local_110;
          }
          else if ((int)local_f0.value - 4U < 3) {
            fVar24 = (fVar23 - local_110) * 0.5 + 0.0;
          }
        }
        if ((fVar21 < (float)local_e8._0_4_ / (fVar23 / fVar22)) &&
           (local_10c = (fVar23 / (float)local_e8._0_4_) * fVar21, (uint)local_f0.value < 10)) {
          if ((0x124U >> ((uint)local_f0.value & 0x1f) & 1) == 0) {
            if ((0x248U >> ((uint)local_f0.value & 0x1f) & 1) != 0) {
              fVar26 = fVar22 - local_10c;
            }
          }
          else {
            fVar26 = (fVar22 - local_10c) * 0.5 + 0.0;
          }
        }
      }
      local_e8._0_4_ = fVar21;
      local_98.a = fVar21 / local_10c;
      local_98.d = fVar25 / local_110;
      local_98.b = 0.0;
      local_98.c = 0.0;
      local_98.e = -fVar26 * local_98.a;
      local_98.f = -fVar24 * local_98.d;
      plutovg_canvas_set_fill_rule(context->canvas,PLUTOVG_FILL_RULE_NON_ZERO);
      plutovg_canvas_set_opacity(context->canvas,local_78.opacity);
      plutovg_canvas_set_matrix(context->canvas,&local_78.matrix);
      plutovg_canvas_translate(context->canvas,(float)local_c8._0_4_,(float)local_b8._0_4_);
      plutovg_canvas_set_texture(context->canvas,surface,PLUTOVG_TEXTURE_TYPE_PLAIN,1.0,&local_98);
      plutovg_canvas_fill_rect(context->canvas,0.0,0.0,(float)local_e8._0_4_,fVar25);
      plutovg_surface_destroy(surface);
    }
  }
  goto LAB_00105be0;
}

Assistant:

static void render_element(const element_t* element, const render_context_t* context, render_state_t* state)
{
    switch(element->id) {
    case TAG_SVG:
        render_svg(element, context, state);
        break;
    case TAG_USE:
        render_use(element, context, state);
        break;
    case TAG_G:
        render_g(element, context, state);
        break;
    case TAG_LINE:
        render_line(element, context, state);
        break;
    case TAG_ELLIPSE:
        render_ellipse(element, context, state);
        break;
    case TAG_CIRCLE:
        render_circle(element, context, state);
        break;
    case TAG_RECT:
        render_rect(element, context, state);
        break;
    case TAG_POLYLINE:
    case TAG_POLYGON:
        render_poly(element, context, state);
        break;
    case TAG_PATH:
        render_path(element, context, state);
        break;
    case TAG_IMAGE:
        render_image(element, context, state);
        break;
    }
}